

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O3

SeatPromptResult *
console_confirm_weak_crypto_primitive
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *algtype,char *algname,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  size_t len;
  void *buf;
  termios cf;
  char line [32];
  termios newmode;
  termios oldmode;
  
  premsg(&cf);
  fprintf(_stderr,
          "The first %s supported by the server is\n%s, which is below the configured warning threshold.\n"
          ,algtype,algname);
  if (console_batch_mode == true) {
    fputs("Connection abandoned.\n",_stderr);
    if (stderr_is_a_tty == '\x01') {
      tcsetattr(2,1,(termios *)&cf);
    }
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot confirm a weak crypto primitive in batch mode");
  }
  else {
    fputs("Continue with connection? (y/n) ",_stderr);
    fflush(_stderr);
    tcgetattr(0,(termios *)&oldmode);
    newmode.c_iflag = oldmode.c_iflag;
    newmode.c_oflag = oldmode.c_oflag;
    newmode.c_line = oldmode.c_line;
    newmode.c_cc[0] = oldmode.c_cc[0];
    newmode.c_cc[1] = oldmode.c_cc[1];
    newmode.c_cc[2] = oldmode.c_cc[2];
    newmode.c_cc[3] = oldmode.c_cc[3];
    newmode.c_cc[4] = oldmode.c_cc[4];
    newmode.c_cc[5] = oldmode.c_cc[5];
    newmode.c_cc[6] = oldmode.c_cc[6];
    newmode.c_cc[7] = oldmode.c_cc[7];
    newmode.c_cc[8] = oldmode.c_cc[8];
    newmode.c_cc[9] = oldmode.c_cc[9];
    newmode.c_cc[10] = oldmode.c_cc[10];
    newmode.c_cc[0xb] = oldmode.c_cc[0xb];
    newmode.c_cc[0xc] = oldmode.c_cc[0xc];
    newmode.c_cc[0xd] = oldmode.c_cc[0xd];
    newmode.c_cc[0xe] = oldmode.c_cc[0xe];
    newmode.c_cc[0xf] = oldmode.c_cc[0xf];
    newmode.c_cc[0x10] = oldmode.c_cc[0x10];
    newmode.c_cc[0x11] = oldmode.c_cc[0x11];
    newmode.c_cc[0x12] = oldmode.c_cc[0x12];
    newmode.c_cc[0x13] = oldmode.c_cc[0x13];
    newmode.c_cc[0x14] = oldmode.c_cc[0x14];
    newmode.c_cc[0x15] = oldmode.c_cc[0x15];
    newmode.c_cc[0x16] = oldmode.c_cc[0x16];
    newmode.c_ispeed = oldmode.c_ispeed;
    newmode.c_ospeed = oldmode.c_ospeed;
    newmode._8_8_ = oldmode._8_8_ | 0xb00000000;
    buf = (void *)0x0;
    tcsetattr(0,0,(termios *)&newmode);
    line[0] = '\0';
    block_and_read((wchar_t)line,buf,len);
    tcsetattr(0,0,(termios *)&oldmode);
    if ((line[0] & 0xdfU) == 0x59) {
      if (stderr_is_a_tty == '\x01') {
        tcsetattr(2,1,(termios *)&cf);
      }
      __return_storage_ptr__->kind = SPRK_OK;
    }
    else {
      fputs("Connection abandoned.\n",_stderr);
      if (stderr_is_a_tty == '\x01') {
        tcsetattr(2,1,(termios *)&cf);
      }
      __return_storage_ptr__->kind = SPRK_USER_ABORT;
    }
    __return_storage_ptr__->errdata_lit = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_confirm_weak_crypto_primitive(
    Seat *seat, const char *algtype, const char *algname,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;

    premsg(&cf);
    fprintf(stderr, weakcrypto_msg_common_fmt, algtype, algname);

    if (console_batch_mode) {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_SW_ABORT("Cannot confirm a weak crypto primitive "
                            "in batch mode");
    }

    fputs(console_continue_prompt, stderr);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    if (line[0] == 'y' || line[0] == 'Y') {
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}